

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.cpp
# Opt level: O3

int __thiscall DSDcc::Golay_20_8::init(Golay_20_8 *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  byte bVar4;
  int ip1;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  int syndromeI;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uchar uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 *puVar18;
  uint uVar19;
  undefined1 *puVar20;
  ulong uVar21;
  undefined1 *puVar22;
  uchar uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  ulong local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  memset(this,0xff,0x3000);
  puVar3 = &m_H;
  local_38 = &DAT_001296b2;
  local_40 = &DAT_001296b1;
  local_48 = 2;
  uVar15 = 1;
  uVar17 = 0;
  do {
    uVar11 = (uchar)uVar17;
    puVar18 = local_40;
    puVar20 = local_38;
    uVar24 = local_48;
    uVar21 = uVar15;
    if (uVar17 < 7) {
      do {
        uVar23 = (uchar)uVar21;
        puVar22 = puVar20;
        uVar2 = uVar24;
        uVar8 = uVar21;
        while (uVar1 = uVar2, uVar8 < 7) {
          lVar10 = 0;
          bVar4 = 0xb;
          uVar8 = 0;
          do {
            uVar8 = (ulong)((int)uVar8 +
                           (((uint)(byte)puVar22[lVar10] +
                             (uint)(byte)puVar18[lVar10] + (uint)(byte)puVar3[lVar10] & 1) <<
                           (bVar4 & 0x1f)));
            bVar4 = bVar4 - 1;
            lVar10 = lVar10 + 0x14;
          } while (lVar10 != 0xf0);
          this->m_corr[uVar8][0] = uVar11;
          this->m_corr[uVar8][1] = uVar23;
          this->m_corr[uVar8][2] = (uchar)uVar1;
          puVar22 = puVar22 + 1;
          uVar2 = uVar1 + 1;
          uVar8 = uVar1;
        }
        uVar21 = uVar21 + 1;
        lVar10 = 0;
        bVar4 = 0xb;
        uVar8 = 0;
        do {
          uVar9 = (int)uVar8 +
                  (((uint)(byte)puVar18[lVar10] + (uint)(byte)puVar3[lVar10] & 1) << (bVar4 & 0x1f))
          ;
          uVar8 = (ulong)uVar9;
          bVar4 = bVar4 - 1;
          lVar10 = lVar10 + 0x14;
        } while (lVar10 != 0xf0);
        this->m_corr[uVar8][0] = uVar11;
        this->m_corr[uVar8][1] = uVar23;
        uVar5 = 0xb;
        uVar6 = '\b';
        do {
          uVar12 = uVar9 ^ 1 << (uVar5 & 0x1f);
          this->m_corr[uVar12][0] = uVar11;
          this->m_corr[uVar12][1] = uVar23;
          this->m_corr[uVar12][2] = uVar6;
          uVar6 = uVar6 + '\x01';
          bVar27 = uVar5 != 0;
          uVar5 = uVar5 - 1;
        } while (bVar27);
        puVar18 = puVar18 + 1;
        puVar20 = puVar20 + 1;
        uVar24 = uVar24 + 1;
      } while (uVar21 != 8);
    }
    uVar17 = uVar17 + 1;
    uVar21 = 0;
    bVar4 = 0xb;
    lVar10 = -0xf0;
    do {
      uVar9 = (int)uVar21 + ((uint)(byte)puVar3[lVar10 + 0xf0] << (bVar4 & 0x1f));
      uVar21 = (ulong)uVar9;
      bVar4 = bVar4 - 1;
      lVar10 = lVar10 + 0x14;
    } while (lVar10 != 0);
    this->m_corr[uVar21][0] = uVar11;
    uVar5 = 0;
    uVar12 = 10;
    uVar23 = '\t';
    do {
      uVar25 = uVar9 ^ 1 << ((byte)(0xb - (char)uVar5) & 0x1f);
      this->m_corr[uVar25][0] = uVar11;
      uVar7 = (char)uVar5 + '\b';
      this->m_corr[uVar25][1] = uVar7;
      uVar6 = uVar23;
      uVar14 = uVar12;
      if (uVar5 < 0xb) {
        do {
          uVar13 = uVar25 ^ 1 << (uVar14 & 0x1f);
          this->m_corr[uVar13][0] = uVar11;
          this->m_corr[uVar13][1] = uVar7;
          this->m_corr[uVar13][2] = uVar6;
          bVar27 = uVar14 != 0;
          uVar6 = uVar6 + '\x01';
          uVar14 = uVar14 - 1;
        } while (bVar27);
      }
      uVar5 = uVar5 + 1;
      uVar12 = uVar12 - 1;
      uVar23 = uVar23 + '\x01';
    } while (uVar5 != 0xc);
    local_48 = local_48 + 1;
    uVar15 = uVar15 + 1;
    local_38 = local_38 + 1;
    local_40 = local_40 + 1;
    puVar3 = puVar3 + 1;
  } while (uVar17 != 8);
  uVar5 = 9;
  uVar9 = 0;
  do {
    uVar13 = 1 << (0xbU - (char)uVar9 & 0x1f);
    uVar11 = (char)uVar9 + '\b';
    this->m_corr[uVar13][0] = uVar11;
    uVar25 = uVar9 + 1;
    uVar14 = uVar25;
    uVar12 = uVar5;
    if (uVar9 < 0xb) {
      do {
        uVar16 = uVar13 ^ 1 << ((byte)(0xb - (char)uVar14) & 0x1f);
        this->m_corr[uVar16][0] = uVar11;
        uVar23 = (char)uVar14 + '\b';
        this->m_corr[uVar16][1] = uVar23;
        uVar19 = uVar12;
        for (uVar9 = uVar14; uVar9 < 0xb; uVar9 = uVar9 + 1) {
          uVar26 = uVar16 ^ 1 << (uVar19 & 0x1f);
          this->m_corr[uVar26][0] = uVar11;
          this->m_corr[uVar26][1] = uVar23;
          this->m_corr[uVar26][2] = (char)uVar9 + '\t';
          uVar19 = uVar19 - 1;
        }
        uVar14 = uVar14 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar14 != 0xc);
    }
    uVar5 = uVar5 - 1;
    uVar9 = uVar25;
  } while (uVar25 != 0xc);
  return uVar5;
}

Assistant:

void Golay_20_8::init()
{
    memset (m_corr, 0xFF, 3*4096);

    for (int i1 = 0; i1 < 8; i1++)
    {
        for (int i2 = i1+1; i2 < 8; i2++)
        {
            for (int i3 = i2+1; i3 < 8; i3++)
            {
                // 3 bit patterns
                int syndromeI = 0;

                for (int ir = 0; ir < 12; ir++)
                {
                    syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2] +  m_H[20*ir + i3]) % 2) << (11-ir);
                }

                m_corr[syndromeI][0] = i1;
                m_corr[syndromeI][1] = i2;
                m_corr[syndromeI][2] = i3;
            }

            // 2 bit patterns
            int syndromeI = 0;

            for (int ir = 0; ir < 12; ir++)
            {
                syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2]) % 2) << (11-ir);
            }

            m_corr[syndromeI][0] = i1;
            m_corr[syndromeI][1] = i2;

            // 1 possible bit flip left in the parity part
            for (int ip = 0; ip < 12; ip++)
            {
                int syndromeIP = syndromeI ^ (1 << (11-ip));
                m_corr[syndromeIP][0] = i1;
                m_corr[syndromeIP][1] = i2;
                m_corr[syndromeIP][2] = 8 + ip;
            }
        }

        // single bit patterns
        int syndromeI = 0;

        for (int ir = 0; ir < 12; ir++)
        {
            syndromeI += m_H[20*ir + i1] << (11-ir);

        }

        m_corr[syndromeI][0] = i1;

        for (int ip1 = 0; ip1 < 12; ip1++) // 1 more bit flip in parity
        {
            int syndromeIP1 = syndromeI ^ (1 << (11-ip1));
            m_corr[syndromeIP1][0] = i1;
            m_corr[syndromeIP1][1] = 8 + ip1;

            for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
            {
                int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
                m_corr[syndromeIP2][0] = i1;
                m_corr[syndromeIP2][1] = 8 + ip1;
                m_corr[syndromeIP2][2] = 8 + ip2;
            }
        }
    }

    // no bit patterns (in message) -> all in parity
    for (int ip1 = 0; ip1 < 12; ip1++) // 1 bit flip in parity
    {
        int syndromeIP1 =  (1 << (11-ip1));
        m_corr[syndromeIP1][0] = 8 + ip1;

        for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
        {
            int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
            m_corr[syndromeIP2][0] = 8 + ip1;
            m_corr[syndromeIP2][1] = 8 + ip2;

            for (int ip3 = ip2+1; ip3 < 12; ip3++) // 1 more bit flip in parity
            {
                int syndromeIP3 = syndromeIP2 ^ (1 << (11-ip3));
                m_corr[syndromeIP3][0] = 8 + ip1;
                m_corr[syndromeIP3][1] = 8 + ip2;
                m_corr[syndromeIP3][2] = 8 + ip3;
            }
        }
    }
}